

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlNodeSetPtr xmlXPathNodeSetMerge(xmlNodeSetPtr val1,xmlNodeSetPtr val2)

{
  int iVar1;
  xmlNodePtr pxVar2;
  bool bVar3;
  int iVar4;
  xmlNodePtr pxVar5;
  xmlNodePtr nsNode;
  xmlNsPtr ns;
  xmlNodePtr n2;
  xmlNodePtr n1;
  int skip;
  int initNr;
  int j;
  int i;
  xmlNodeSetPtr val2_local;
  xmlNodeSetPtr val1_local;
  
  val2_local = val1;
  if ((val1 == (xmlNodeSetPtr)0x0) &&
     (val2_local = xmlXPathNodeSetCreate((xmlNodePtr)0x0), val2_local == (xmlNodeSetPtr)0x0)) {
    val1_local = (xmlNodeSetPtr)0x0;
  }
  else if (val2 == (xmlNodeSetPtr)0x0) {
    val1_local = val2_local;
  }
  else {
    iVar1 = val2_local->nodeNr;
    for (initNr = 0; initNr < val2->nodeNr; initNr = initNr + 1) {
      pxVar5 = val2->nodeTab[initNr];
      bVar3 = false;
      for (skip = 0; skip < iVar1; skip = skip + 1) {
        pxVar2 = val2_local->nodeTab[skip];
        if (pxVar2 == pxVar5) {
          bVar3 = true;
          break;
        }
        if ((((pxVar2->type == XML_NAMESPACE_DECL) && (pxVar5->type == XML_NAMESPACE_DECL)) &&
            ((_xmlNs *)pxVar2->_private == (_xmlNs *)pxVar5->_private)) &&
           (iVar4 = xmlStrEqual((xmlChar *)pxVar2->children,(xmlChar *)pxVar5->children), iVar4 != 0
           )) {
          bVar3 = true;
          break;
        }
      }
      if (!bVar3) {
        if ((val2_local->nodeMax <= val2_local->nodeNr) &&
           (iVar4 = xmlXPathNodeSetGrow(val2_local), iVar4 < 0)) {
LAB_00223d17:
          xmlXPathFreeNodeSet(val2_local);
          return (xmlNodeSetPtr)0x0;
        }
        if (pxVar5->type == XML_NAMESPACE_DECL) {
          pxVar5 = xmlXPathNodeSetDupNs((xmlNodePtr)pxVar5->_private,(xmlNsPtr)pxVar5);
          if (pxVar5 == (xmlNodePtr)0x0) goto LAB_00223d17;
          iVar4 = val2_local->nodeNr;
          val2_local->nodeNr = iVar4 + 1;
          val2_local->nodeTab[iVar4] = pxVar5;
        }
        else {
          iVar4 = val2_local->nodeNr;
          val2_local->nodeNr = iVar4 + 1;
          val2_local->nodeTab[iVar4] = pxVar5;
        }
      }
    }
    val1_local = val2_local;
  }
  return val1_local;
}

Assistant:

xmlNodeSetPtr
xmlXPathNodeSetMerge(xmlNodeSetPtr val1, xmlNodeSetPtr val2) {
    int i, j, initNr, skip;
    xmlNodePtr n1, n2;

    if (val1 == NULL) {
	val1 = xmlXPathNodeSetCreate(NULL);
        if (val1 == NULL)
            return (NULL);
    }
    if (val2 == NULL)
        return(val1);

    /* @@ with_ns to check whether namespace nodes should be looked at @@ */
    initNr = val1->nodeNr;

    for (i = 0;i < val2->nodeNr;i++) {
	n2 = val2->nodeTab[i];
	/*
	 * check against duplicates
	 */
	skip = 0;
	for (j = 0; j < initNr; j++) {
	    n1 = val1->nodeTab[j];
	    if (n1 == n2) {
		skip = 1;
		break;
	    } else if ((n1->type == XML_NAMESPACE_DECL) &&
		       (n2->type == XML_NAMESPACE_DECL)) {
		if ((((xmlNsPtr) n1)->next == ((xmlNsPtr) n2)->next) &&
		    (xmlStrEqual(((xmlNsPtr) n1)->prefix,
			((xmlNsPtr) n2)->prefix)))
		{
		    skip = 1;
		    break;
		}
	    }
	}
	if (skip)
	    continue;

	/*
	 * grow the nodeTab if needed
	 */
        if (val1->nodeNr >= val1->nodeMax) {
            if (xmlXPathNodeSetGrow(val1) < 0)
                goto error;
        }
	if (n2->type == XML_NAMESPACE_DECL) {
	    xmlNsPtr ns = (xmlNsPtr) n2;
            xmlNodePtr nsNode = xmlXPathNodeSetDupNs((xmlNodePtr) ns->next, ns);

            if (nsNode == NULL)
                goto error;
	    val1->nodeTab[val1->nodeNr++] = nsNode;
	} else
	    val1->nodeTab[val1->nodeNr++] = n2;
    }

    return(val1);

error:
    xmlXPathFreeNodeSet(val1);
    return(NULL);
}